

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Option<const_Kernel::TermList_&> __thiscall
Lib::Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash>::tryGet
          (Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *this,PolyNf *key)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict6
  RVar4;
  uint uVar5;
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  *in_RDX;
  uint uVar6;
  uint *puVar7;
  anon_class_16_2_d708292f f;
  anon_class_1_0_00000001 local_29;
  
  uVar6 = *(byte *)&(((PolyNfSuper *)&in_RDX->_inner)->_inner).
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          & 3;
  f.this = in_RDX;
  f.f = &local_29;
  RVar4 = CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ::
          switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      *)in_RDX,f);
  uVar6 = RVar4 + uVar6 * 0x40 + 0x9e3779b9 ^ uVar6;
  uVar6 = uVar6 + (uVar6 == 0);
  lVar1 = *(long *)((key->super_PolyNfSuper)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content + 7);
  uVar2 = (ulong)uVar6 %
          (ulong)*(uint *)&(key->super_PolyNfSuper)._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           .
                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ;
  uVar5 = *(uint *)(lVar1 + uVar2 * 0x28);
  if (uVar5 != 0) {
    puVar7 = (uint *)(lVar1 + uVar2 * 0x28);
    do {
      if (uVar5 == uVar6) {
        bVar3 = Kernel::operator==((PolyNf *)(puVar7 + 1),(PolyNf *)in_RDX);
        if (bVar3) {
          puVar7 = puVar7 + 8;
          goto LAB_005adc99;
        }
      }
      puVar7 = puVar7 + 10;
      if (puVar7 == *(uint **)((key->super_PolyNfSuper)._inner.
                               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                               .
                               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                               ._content + 0xf)) {
        puVar7 = *(uint **)((key->super_PolyNfSuper)._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                            .
                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                            ._content + 7);
      }
      uVar5 = *puVar7;
    } while (uVar5 != 0);
  }
  this->_capacity = 0;
  this->_noOfEntries = 0;
  puVar7 = (uint *)0x0;
LAB_005adc99:
  *(uint **)this = puVar7;
  return (OptionBase<const_Kernel::TermList_&>)(OptionBase<const_Kernel::TermList_&>)this;
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }